

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O3

int pl_p2li(int *pxsrc,int xs,short *lldst,int npix)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  short sVar12;
  uint uVar13;
  ushort *puVar14;
  ushort uVar15;
  short *psVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  
  if (npix < 1) {
    return 0;
  }
  lldst[2] = -100;
  lldst[0] = 0;
  lldst[1] = 7;
  lldst[5] = 0;
  lldst[6] = 0;
  iVar7 = npix + xs;
  iVar4 = npix + xs;
  lVar22 = (long)xs;
  uVar10 = (ulong)(uint)pxsrc[lVar22 + -1];
  if (pxsrc[lVar22 + -1] < 1) {
    uVar10 = 0;
  }
  iVar18 = 1;
  iVar19 = 8;
  uVar5 = 0;
  iVar21 = xs;
  do {
    iVar9 = (int)uVar10;
    iVar2 = (int)lVar22;
    iVar17 = xs;
    if (lVar22 < iVar4 + -1) {
      uVar5 = (ulong)(uint)pxsrc[lVar22];
      if (pxsrc[lVar22] < 1) {
        uVar5 = 0;
      }
      uVar6 = uVar10;
      if (((int)uVar5 != iVar9) && (uVar6 = uVar5, xs = iVar2 + 1, iVar9 != 0)) goto LAB_0019f9ee;
    }
    else {
      if (iVar9 == 0) {
        iVar17 = iVar7;
      }
LAB_0019f9ee:
      uVar13 = iVar17 - iVar21;
      iVar20 = iVar19;
      if ((iVar9 < 1) || (uVar8 = iVar9 - iVar18, iVar18 = iVar9, uVar8 == 0)) {
LAB_0019fa51:
        if (0 < (int)uVar13) {
          psVar16 = lldst + (long)iVar20 + -1;
          lVar11 = (long)iVar20 << 0x20;
          do {
            lVar11 = lVar11 + 0x100000000;
            iVar20 = iVar20 + 1;
            sVar12 = (short)uVar13;
            if (0xffe < uVar13) {
              sVar12 = 0xfff;
            }
            *psVar16 = sVar12;
            psVar16 = psVar16 + 1;
            bVar1 = 0xfff < uVar13;
            uVar13 = uVar13 - 0xfff;
          } while (bVar1);
          if ((0 < iVar9) && (iVar17 == iVar2)) {
            psVar16 = (short *)((long)lldst + (lVar11 >> 0x1f) + -4);
            *psVar16 = *psVar16 + 0x5001;
            goto LAB_0019fae6;
          }
        }
        if (0 < (iVar2 + 1) - iVar17) {
          puVar14 = (ushort *)(lldst + (long)iVar20 + -1);
          uVar13 = (iVar2 - iVar17) + 0x1000;
          do {
            uVar13 = uVar13 - 0xfff;
            uVar8 = 0xfff;
            if (uVar13 < 0xfff) {
              uVar8 = uVar13;
            }
            *puVar14 = (ushort)uVar8 | 0x4000;
            puVar14 = puVar14 + 1;
            iVar20 = iVar20 + 1;
          } while (0xfff < uVar13);
        }
      }
      else {
        uVar3 = -uVar8;
        if (0 < (int)uVar8) {
          uVar3 = uVar8;
        }
        if (0xfff < uVar3) {
          lldst[(long)iVar19 + -1] = (ushort)uVar10 & 0xfff | 0x1000;
          lldst[iVar19] = (short)(uVar10 >> 0xc);
          iVar20 = iVar19 + 2;
          goto LAB_0019fa51;
        }
        uVar15 = 0x3000 - (short)uVar8;
        if (-1 < (int)uVar8) {
          uVar15 = (short)uVar8 + 0x2000;
        }
        lldst[(long)iVar19 + -1] = uVar15;
        iVar20 = iVar19 + 1;
        if ((iVar17 != iVar2) || (uVar13 != 0)) goto LAB_0019fa51;
        lldst[(long)iVar19 + -1] = uVar15 | 0x4000;
      }
LAB_0019fae6:
      iVar21 = iVar2 + 1;
      uVar6 = uVar5;
      iVar19 = iVar20;
      xs = iVar2 + 1;
    }
    lVar22 = lVar22 + 1;
    uVar5 = uVar6;
    uVar10 = uVar6;
    if (iVar7 <= lVar22) {
      iVar4 = iVar19 + -1;
      iVar7 = iVar19 + 0x7ffe;
      if (-1 < iVar4) {
        iVar7 = iVar4;
      }
      lldst[3] = ((short)iVar19 - ((ushort)iVar7 & 0x8000)) + -1;
      lldst[4] = (short)(iVar7 >> 0xf);
      return iVar4;
    }
  } while( true );
}

Assistant:

int pl_p2li (int *pxsrc, int xs, short *lldst, int npix)
/* int *pxsrc;                      input pixel array */
/* int xs;                          starting index in pxsrc (?) */
/* short *lldst;                    encoded line list */
/* int npix;                        number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2, i__3;

    /* Local variables */
    int zero, v, x1, hi, ip, dv, xe, np, op, iz, nv = 0, pv, nz;

    /* Parameter adjustments */
    --lldst;
    --pxsrc;

    /* Function Body */
    if (! (npix <= 0)) {
        goto L110;
    }
    ret_val = 0;
    goto L100;
L110:
    lldst[3] = -100;
    lldst[2] = 7;
    lldst[1] = 0;
    lldst[6] = 0;
    lldst[7] = 0;
    xe = xs + npix - 1;
    op = 8;
    zero = 0;
/* Computing MAX */
    i__1 = zero, i__2 = pxsrc[xs];
    pv = max(i__1,i__2);
    x1 = xs;
    iz = xs;
    hi = 1;
    i__1 = xe;
    for (ip = xs; ip <= i__1; ++ip) {
        if (! (ip < xe)) {
            goto L130;
        }
/* Computing MAX */
        i__2 = zero, i__3 = pxsrc[ip + 1];
        nv = max(i__2,i__3);
        if (! (nv == pv)) {
            goto L140;
        }
        goto L120;
L140:
        if (! (pv == 0)) {
            goto L150;
        }
        pv = nv;
        x1 = ip + 1;
        goto L120;
L150:
        goto L131;
L130:
        if (! (pv == 0)) {
            goto L160;
        }
        x1 = xe + 1;
L160:
L131:
        np = ip - x1 + 1;
        nz = x1 - iz;
        if (! (pv > 0)) {
            goto L170;
        }
        dv = pv - hi;
        if (! (dv != 0)) {
            goto L180;
        }
        hi = pv;
        if (! (abs(dv) > 4095)) {
            goto L190;
        }
        lldst[op] = (short) ((pv & 4095) + 4096);
        ++op;
        lldst[op] = (short) (pv / 4096);
        ++op;
        goto L191;
L190:
        if (! (dv < 0)) {
            goto L200;
        }
        lldst[op] = (short) (-dv + 12288);
        goto L201;
L200:
        lldst[op] = (short) (dv + 8192);
L201:
        ++op;
        if (! (np == 1 && nz == 0)) {
            goto L210;
        }
        v = lldst[op - 1];
        lldst[op - 1] = (short) (v | 16384);
        goto L91;
L210:
L191:
L180:
L170:
        if (! (nz > 0)) {
            goto L220;
        }
L230:
        if (! (nz > 0)) {
            goto L232;
        }
        lldst[op] = (short) min(4095,nz);
        ++op;
/* L231: */
        nz += -4095;
        goto L230;
L232:
        if (! (np == 1 && pv > 0)) {
            goto L240;
        }
        lldst[op - 1] = (short) (lldst[op - 1] + 20481);
        goto L91;
L240:
L220:
L250:
        if (! (np > 0)) {
            goto L252;
        }
        lldst[op] = (short) (min(4095,np) + 16384);
        ++op;
/* L251: */
        np += -4095;
        goto L250;
L252:
L91:
        x1 = ip + 1;
        iz = x1;
        pv = nv;
L120:
        ;
    }
/* L121: */
    lldst[4] = (short) ((op - 1) % 32768);
    lldst[5] = (short) ((op - 1) / 32768);
    ret_val = op - 1;
    goto L100;
L100:
    return ret_val;
}